

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility.cpp
# Opt level: O1

void SetCompatibilityParams(void)

{
  uint sect;
  int iVar1;
  int iVar2;
  line_t_conflict *plVar3;
  line_t_conflict *plVar4;
  int *piVar5;
  sector_t_conflict *psVar6;
  int ii;
  long lVar7;
  uint i;
  uint uVar8;
  ulong uVar9;
  
  if ((ii_compatparams != -1) &&
     (uVar8 = ii_compatparams, (uint)ii_compatparams < CompatParams.Count)) {
    do {
      plVar4 = lines;
      psVar6 = sectors;
      piVar5 = CompatParams.Array;
      switch(CompatParams.Array[uVar8]) {
      case 0:
        goto switchD_0035c801_caseD_0;
      case 1:
        if (CompatParams.Array[uVar8 + 1] < numlines) {
          lines[CompatParams.Array[uVar8 + 1]].flags =
               lines[CompatParams.Array[uVar8 + 1]].flags & ~CompatParams.Array[uVar8 + 2];
        }
        break;
      case 2:
        if (CompatParams.Array[uVar8 + 1] < numlines) {
          lines[CompatParams.Array[uVar8 + 1]].flags =
               lines[CompatParams.Array[uVar8 + 1]].flags | CompatParams.Array[uVar8 + 2];
        }
        break;
      case 3:
        iVar1 = CompatParams.Array[uVar8 + 1];
        if (iVar1 < numlines) {
          lines[iVar1].special = CompatParams.Array[uVar8 + 2];
          lVar7 = 0;
          do {
            plVar4[iVar1].args[lVar7] = piVar5[uVar8 + 3 + (int)lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 5);
        }
        uVar8 = uVar8 + 8;
        goto switchD_0035c801_default;
      case 4:
        iVar1 = CompatParams.Array[uVar8 + 1];
        if (iVar1 < numlines) {
          plVar3 = lines + iVar1;
          plVar3->special = 0;
          plVar3->args[0] = 0;
          plVar3->args[1] = 0;
          plVar3->args[2] = 0;
          plVar4 = plVar4 + iVar1;
          plVar4->args[3] = 0;
          plVar4->args[4] = 0;
        }
        uVar8 = uVar8 + 2;
        goto switchD_0035c801_default;
      case 5:
        if (CompatParams.Array[uVar8 + 1] < numlines) {
          lines[CompatParams.Array[uVar8 + 1]].activation = CompatParams.Array[uVar8 + 2];
        }
        break;
      case 6:
        iVar1 = CompatParams.Array[uVar8 + 1];
        if (iVar1 < numsectors) {
          iVar2 = CompatParams.Array[uVar8 + 2];
          sectors[iVar1].floorplane.D =
               sectors[iVar1].floorplane.D -
               sectors[iVar1].floorplane.normal.Z * (double)iVar2 * 1.52587890625e-05;
          psVar6[iVar1].planes[0].TexZ =
               (double)iVar2 * 1.52587890625e-05 + psVar6[iVar1].planes[0].TexZ;
        }
        break;
      case 7:
        if (CompatParams.Array[uVar8 + 1] < numsectors) {
          sectors[CompatParams.Array[uVar8 + 1]].special = (short)CompatParams.Array[uVar8 + 2];
        }
        break;
      case 8:
        if ((CompatParams.Array[uVar8 + 1] < numlines) &&
           (lines[CompatParams.Array[uVar8 + 1]].sidedef[CompatParams.Array[uVar8 + 2]] !=
            (side_t *)0x0)) {
          uVar9 = -(ulong)((double)CompatParams.Array[uVar8 + 4] * 1.52587890625e-05 == 0.0);
          lines[CompatParams.Array[uVar8 + 1]].sidedef[CompatParams.Array[uVar8 + 2]]->textures
          [CompatParams.Array[uVar8 + 3]].yScale =
               (double)(uVar9 & 0x3ff0000000000000 |
                       ~uVar9 & (ulong)((double)CompatParams.Array[uVar8 + 4] * 1.52587890625e-05));
        }
        uVar8 = uVar8 + 5;
        goto switchD_0035c801_default;
      case 9:
        if ((uint)CompatParams.Array[uVar8 + 1] < MapThingsConverted.Count) {
          MapThingsConverted.Array[CompatParams.Array[uVar8 + 1]].pos.Z =
               (double)CompatParams.Array[uVar8 + 2] * 0.00390625;
        }
        break;
      case 10:
        sect = CompatParams.Array[uVar8 + 1];
        if (sect < (uint)numsectors) {
          if (CompatParams.Array[uVar8 + 2] == 0) {
            FTagManager::RemoveSectorTags(&tagManager,sect);
          }
          else {
            FTagManager::AddSectorTag(&tagManager,sect,CompatParams.Array[uVar8 + 2]);
          }
        }
        break;
      case 0xb:
        if ((uint)CompatParams.Array[uVar8 + 1] < MapThingsConverted.Count) {
          MapThingsConverted.Array[CompatParams.Array[uVar8 + 1]].flags =
               CompatParams.Array[uVar8 + 2];
        }
        break;
      default:
        goto switchD_0035c801_default;
      }
      uVar8 = uVar8 + 3;
switchD_0035c801_default:
    } while (uVar8 < CompatParams.Count);
  }
switchD_0035c801_caseD_0:
  return;
}

Assistant:

void SetCompatibilityParams()
{
	if (ii_compatparams != -1)
	{
		unsigned i = ii_compatparams;

		while (i < CompatParams.Size() && CompatParams[i] != CP_END)
		{
			switch (CompatParams[i])
			{
				case CP_CLEARFLAGS:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->flags &= ~CompatParams[i+2];
					}
					i+=3;
					break;
				}
				case CP_SETFLAGS:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->flags |= CompatParams[i+2];
					}
					i+=3;
					break;
				}
				case CP_SETSPECIAL:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->special = CompatParams[i+2];
						for(int ii=0;ii<5;ii++)
						{
							line->args[ii] = CompatParams[i+ii+3];
						}
					}
					i+=8;
					break;
				}
				case CP_CLEARSPECIAL:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->special = 0;
						memset(line->args, 0, sizeof(line->args));
					}
					i += 2;
					break;
				}
				case CP_SETACTIVATION:
				{
					if (CompatParams[i+1] < numlines)
					{
						line_t *line = &lines[CompatParams[i+1]];
						line->activation = CompatParams[i+2];
					}
					i += 3;
					break;
				}
				case CP_SECTORFLOOROFFSET:
				{
					if (CompatParams[i+1] < numsectors)
					{
						sector_t *sec = &sectors[CompatParams[i+1]];
						const double delta = CompatParams[i + 2] / 65536.0;
						sec->floorplane.ChangeHeight(delta);
						sec->ChangePlaneTexZ(sector_t::floor, delta);
					}
					i += 3;
					break;
				}
				case CP_SETSECTORSPECIAL:
				{
					const int index = CompatParams[i + 1];
					if (index < numsectors)
					{
						sectors[index].special = CompatParams[i + 2];
					}
					i += 3;
					break;
				}
				case CP_SETWALLYSCALE:
				{
					if (CompatParams[i+1] < numlines)
					{
						side_t *side = lines[CompatParams[i+1]].sidedef[CompatParams[i+2]];
						if (side != NULL)
						{
							side->SetTextureYScale(CompatParams[i+3], CompatParams[i+4] / 65536.);
						}
					}
					i += 5;
					break;
				}
				case CP_SETTHINGZ:
				{
					// When this is called, the things haven't been spawned yet so we can alter the position inside the MapThings array.
					if ((unsigned)CompatParams[i+1] < MapThingsConverted.Size())
					{
						MapThingsConverted[CompatParams[i+1]].pos.Z = CompatParams[i+2]/256.;
					}
					i += 3;
					break;
				}	
				case CP_SETTAG:
				{
					if ((unsigned)CompatParams[i + 1] < (unsigned)numsectors)
					{
						// this assumes that the sector does not have any tags yet!
						if (CompatParams[i + 2] == 0)
						{
							tagManager.RemoveSectorTags(CompatParams[i + 1]);
						}
						else
						{
							tagManager.AddSectorTag(CompatParams[i + 1], CompatParams[i + 2]);
						}
					}
					i += 3;
					break;
				}
				case CP_SETTHINGFLAGS:
				{
					if ((unsigned)CompatParams[i + 1] < MapThingsConverted.Size())
					{
						MapThingsConverted[CompatParams[i + 1]].flags = CompatParams[i + 2];
					}
					i += 3;
					break;
				}
			}
		}
	}
}